

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O0

void __thiscall SmallVector_Clear_Test::TestBody(SmallVector_Clear_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_4a8;
  Message local_4a0;
  size_t local_498;
  uint local_48c;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_1;
  Message local_470 [3];
  size_t local_458;
  uint local_44c;
  undefined1 local_448 [8];
  AssertionResult gtest_ar;
  small_vector<int,_256UL> a;
  SmallVector_Clear_Test *this_local;
  
  pstore::small_vector<int,_256UL>::small_vector((small_vector<int,_256UL> *)&gtest_ar.message_,4);
  local_44c = 4;
  local_458 = pstore::small_vector<int,_256UL>::size((small_vector<int,_256UL> *)&gtest_ar.message_)
  ;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_448,"4U","a.size ()",&local_44c,&local_458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(local_470);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_470);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  pstore::small_vector<int,_256UL>::clear((small_vector<int,_256UL> *)&gtest_ar.message_);
  local_48c = 0;
  local_498 = pstore::small_vector<int,_256UL>::size((small_vector<int,_256UL> *)&gtest_ar.message_)
  ;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_488,"0U","a.size ()",&local_48c,&local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x102,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  pstore::small_vector<int,_256UL>::~small_vector((small_vector<int,_256UL> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST (SmallVector, Clear) {
    // The two containers start out with different sizes; one uses the small
    // buffer, the other, large.
    pstore::small_vector<int> a (std::size_t{4});
    EXPECT_EQ (4U, a.size ());
    a.clear ();
    EXPECT_EQ (0U, a.size ());
}